

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageFieldGenerator::MessageFieldGenerator
          (MessageFieldGenerator *this,FieldDescriptor *descriptor,int messageBitIndex,
          int builderBitIndex)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_FieldGenerator)._vptr_FieldGenerator =
       (_func_int **)&PTR__MessageFieldGenerator_00296af8;
  this->descriptor_ = descriptor;
  p_Var1 = &(this->variables_)._M_t._M_impl.super__Rb_tree_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->messageBitIndex_ = messageBitIndex;
  this->builderBitIndex_ = builderBitIndex;
  anon_unknown_2::SetMessageVariables(descriptor,messageBitIndex,builderBitIndex,&this->variables_);
  return;
}

Assistant:

MessageFieldGenerator::
MessageFieldGenerator(const FieldDescriptor* descriptor,
                      int messageBitIndex,
                      int builderBitIndex)
  : descriptor_(descriptor), messageBitIndex_(messageBitIndex),
    builderBitIndex_(builderBitIndex) {
  SetMessageVariables(descriptor, messageBitIndex, builderBitIndex,
                      &variables_);
}